

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O0

void icu_63::double_conversion::InitialScaledStartValuesNegativeExponentPositivePower
               (uint64_t significand,int exponent,int estimated_power,bool need_boundary_deltas,
               Bignum *numerator,Bignum *denominator,Bignum *delta_minus,Bignum *delta_plus)

{
  Bignum *denominator_local;
  Bignum *numerator_local;
  bool need_boundary_deltas_local;
  int estimated_power_local;
  int exponent_local;
  uint64_t significand_local;
  
  Bignum::AssignUInt64(numerator,significand);
  Bignum::AssignPowerUInt16(denominator,10,estimated_power);
  Bignum::ShiftLeft(denominator,-exponent);
  if (need_boundary_deltas) {
    Bignum::ShiftLeft(denominator,1);
    Bignum::ShiftLeft(numerator,1);
    Bignum::AssignUInt16(delta_plus,1);
    Bignum::AssignUInt16(delta_minus,1);
  }
  return;
}

Assistant:

static void InitialScaledStartValuesNegativeExponentPositivePower(
    uint64_t significand, int exponent,
    int estimated_power, bool need_boundary_deltas,
    Bignum* numerator, Bignum* denominator,
    Bignum* delta_minus, Bignum* delta_plus) {
  // v = f * 2^e with e < 0, and with estimated_power >= 0.
  // This means that e is close to 0 (have a look at how estimated_power is
  // computed).

  // numerator = significand
  //  since v = significand * 2^exponent this is equivalent to
  //  numerator = v * / 2^-exponent
  numerator->AssignUInt64(significand);
  // denominator = 10^estimated_power * 2^-exponent (with exponent < 0)
  denominator->AssignPowerUInt16(10, estimated_power);
  denominator->ShiftLeft(-exponent);

  if (need_boundary_deltas) {
    // Introduce a common denominator so that the deltas to the boundaries are
    // integers.
    denominator->ShiftLeft(1);
    numerator->ShiftLeft(1);
    // Let v = f * 2^e, then m+ - v = 1/2 * 2^e; With the common
    // denominator (of 2) delta_plus equals 2^e.
    // Given that the denominator already includes v's exponent the distance
    // to the boundaries is simply 1.
    delta_plus->AssignUInt16(1);
    // Same for delta_minus. The adjustments if f == 2^p-1 are done later.
    delta_minus->AssignUInt16(1);
  }
}